

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildReg1Int1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstReg,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType_00;
  RegOpnd *this_00;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  IRType type;
  int iVar4;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  iVar4 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar4 == 0x20) {
    valueType_00.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
    type = TyInt32;
  }
  else {
    if (iVar4 != 0x14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x8dc,"((0))","(0)");
      if (bVar2) {
        *puVar3 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    valueType_00.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    type = TyVar;
  }
  BuildArgOut(this,&this_00->super_Opnd,dstReg,offset,type,(ValueType)valueType_00.field_0);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildReg1Int1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstReg, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt32);
    srcOpnd->SetValueType(ValueType::GetInt(false));

    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::ArgOut_Int:
        BuildArgOut(srcOpnd, dstReg, offset, TyVar);
        break;
    case Js::OpCodeAsmJs::I_ArgOut_Int:
        BuildArgOut(srcOpnd, dstReg, offset, TyInt32, ValueType::GetInt(false));
        break;
    default:
        Assume(UNREACHED);
    }
}